

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.cpp
# Opt level: O3

void __thiscall
cali::Blackboard::add(Blackboard *this,cali_id_t key,Entry *value,bool include_in_snapshots)

{
  size_t sVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  cali_id_t *pcVar6;
  
  uVar4 = key;
  do {
    uVar3 = uVar4 % 0x3fd;
    uVar5 = (ulong)(uint)((int)uVar3 << 5);
    uVar4 = uVar4 + 1 + (uVar4 / 0x3fd) * -0x3fd;
  } while (*(long *)((long)&this->hashtable[0].key + uVar5) != -1);
  sVar1 = this->num_entries;
  if (sVar1 - 0x38e < 0xfffffffffffffc02) {
    this->num_skipped = this->num_skipped + 1;
    return;
  }
  pcVar6 = (cali_id_t *)((long)&this->hashtable[0].key + uVar5);
  *pcVar6 = key;
  uVar2 = (value->m_value).m_v.type_and_size;
  pcVar6[1] = (cali_id_t)value->m_node;
  pcVar6[2] = uVar2;
  *(anon_union_8_7_33918203_for_value *)(pcVar6 + 3) = (value->m_value).m_v.value;
  if (include_in_snapshots) {
    this->toc[uVar3 >> 5] = this->toc[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
    this->toctoc = this->toctoc | 1 << (sbyte)(uVar3 >> 5);
  }
  uVar4 = sVar1 + 1;
  this->num_entries = uVar4;
  if (uVar4 <= this->max_num_entries) {
    uVar4 = this->max_num_entries;
  }
  this->max_num_entries = uVar4;
  return;
}

Assistant:

void Blackboard::add(cali_id_t key, const Entry& value, bool include_in_snapshots)
{
    size_t I = find_free_slot(key);

    if (num_entries + (Nmax / 10 + 10) > Nmax) {
        ++num_skipped; // Uh oh, we're full
        return;
    }

    hashtable[I].key   = key;
    hashtable[I].value = value;

    if (include_in_snapshots) {
        toc[I / 32] |= (1 << (I % 32));
        toctoc |= (1 << (I / 32));
    }

    ++num_entries;
    max_num_entries = std::max(num_entries, max_num_entries);
}